

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_concat<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *left,
          ref<immutable::rrb<int,_false,_6>_> *right)

{
  uint32_t *puVar1;
  ref<immutable::rrb_details::tree_node<int,_false>_> *__s;
  uint uVar2;
  uint uVar3;
  rrb<int,_false,_6> *prVar4;
  rrb<int,_false,_6> *prVar5;
  tree_node<int,_false> *ptVar6;
  leaf_node<int,_false> *plVar7;
  long lVar8;
  leaf_node<int,_false> *plVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  undefined4 uVar12;
  uint32_t uVar13;
  ref<immutable::rrb<int,_false,_6>_> rVar14;
  uint32_t uVar15;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  char *__function;
  uint uVar19;
  uint uVar20;
  ref<immutable::rrb_details::leaf_node<int,_false>_> empty_leaf;
  ref<immutable::rrb<int,_false,_6>_> new_rrb;
  ref<immutable::rrb<int,_false,_6>_> left_head;
  ref<immutable::rrb<int,_false,_6>_> left2;
  ref<immutable::rrb_details::internal_node<int,_false>_> root_candidate;
  ref<immutable::rrb_details::tree_node<int,_false>_> find_shift_arg;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_88;
  ref<immutable::rrb<int,_false,_6>_> local_80;
  ref<immutable::rrb<int,_false,_6>_> local_78;
  leaf_node<int,_false> *local_70;
  ref<immutable::rrb<int,_false,_6>_> local_68;
  rrb<int,_false,_6> *local_60;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_58;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_50;
  ref<immutable::rrb_details::leaf_node<int,_false>_> *local_48;
  internal_node<int,_false> *local_40;
  leaf_node<int,_false> *local_38;
  
  prVar4 = left->ptr;
  if (prVar4 != (rrb<int,_false,_6> *)0x0) {
    prVar5 = right->ptr;
    if (prVar4->cnt == 0) {
      *(rrb<int,_false,_6> **)this = prVar5;
      if (prVar5 == (rrb<int,_false,_6> *)0x0) {
        return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
      }
      prVar5->_ref_count = prVar5->_ref_count + 1;
      return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
    }
    if (prVar5 != (rrb<int,_false,_6> *)0x0) {
      if (prVar5->cnt == 0) {
        *(rrb<int,_false,_6> **)this = prVar4;
        prVar4->_ref_count = prVar4->_ref_count + 1;
        return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
      }
      if ((prVar5->root).ptr == (tree_node<int,_false> *)0x0) {
        local_80.ptr = (rrb<int,_false,_6> *)malloc(0x28);
        uVar15 = prVar4->cnt;
        uVar10 = prVar4->shift;
        uVar11 = prVar4->tail_len;
        uVar12 = *(undefined4 *)&prVar4->field_0xc;
        ptVar6 = (prVar4->root).ptr;
        ((local_80.ptr)->tail).ptr = (prVar4->tail).ptr;
        ((local_80.ptr)->root).ptr = ptVar6;
        (local_80.ptr)->cnt = uVar15;
        (local_80.ptr)->shift = uVar10;
        (local_80.ptr)->tail_len = uVar11;
        *(undefined4 *)&(local_80.ptr)->field_0xc = uVar12;
        uVar12 = *(undefined4 *)&prVar4->field_0x24;
        (local_80.ptr)->_ref_count = prVar4->_ref_count;
        *(undefined4 *)&(local_80.ptr)->field_0x24 = uVar12;
        ptVar6 = ((local_80.ptr)->root).ptr;
        if (ptVar6 != (tree_node<int,_false> *)0x0) {
          puVar1 = &ptVar6->_ref_count;
          *puVar1 = *puVar1 + 1;
        }
        plVar7 = ((local_80.ptr)->tail).ptr;
        if (plVar7 != (leaf_node<int,_false> *)0x0) {
          puVar1 = &plVar7->_ref_count;
          *puVar1 = *puVar1 + 1;
        }
        (local_80.ptr)->_ref_count = 1;
        (local_80.ptr)->cnt = (local_80.ptr)->cnt + prVar5->cnt;
        uVar2 = prVar4->tail_len;
        uVar17 = (ulong)uVar2;
        local_60 = (rrb<int,_false,_6> *)this;
        if (uVar17 == 0x40) {
          (local_80.ptr)->tail_len = prVar5->tail_len;
          rrb_details::push_down_tail<int,false,6>((rrb_details *)this,left,&local_80,&prVar5->tail)
          ;
          goto LAB_001460ea;
        }
        local_48 = &(local_80.ptr)->tail;
        uVar20 = prVar5->tail_len + uVar2;
        if (uVar20 < 0x41) {
          local_38 = (prVar4->tail).ptr;
          local_70 = (prVar5->tail).ptr;
          uVar2 = local_38->len;
          uVar3 = local_70->len;
          uVar19 = uVar3 + uVar2;
          local_88.ptr = (leaf_node<int,_false> *)malloc((ulong)uVar19 * 4 + 0x18);
          (local_88.ptr)->len = uVar19;
          (local_88.ptr)->type = LEAF_NODE;
          plVar7 = local_88.ptr + 1;
          (local_88.ptr)->child = (int *)plVar7;
          (local_88.ptr)->guid = 0;
          if (uVar19 != 0) {
            memset(plVar7,0,(ulong)uVar19 * 4);
          }
          if ((ulong)uVar2 != 0) {
            piVar16 = local_38->child;
            uVar17 = 0;
            do {
              (&plVar7->type)[uVar17] = piVar16[uVar17];
              uVar17 = uVar17 + 1;
            } while (uVar2 != uVar17);
          }
          if ((ulong)uVar3 != 0) {
            piVar16 = local_70->child;
            uVar17 = 0;
            do {
              (&plVar7->type)[uVar2 + (int)uVar17] = piVar16[uVar17];
              uVar17 = uVar17 + 1;
            } while (uVar3 != uVar17);
          }
          (local_88.ptr)->_ref_count = 1;
          ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(local_48,&local_88);
          if (local_80.ptr == (rrb<int,_false,_6> *)0x0) goto LAB_00146106;
          (local_80.ptr)->tail_len = uVar20;
          *(rrb<int,_false,_6> **)local_60 = local_80.ptr;
          (local_80.ptr)->_ref_count = (local_80.ptr)->_ref_count + 1;
          this = (immutable *)local_60;
LAB_001460ce:
          if ((local_88.ptr != (leaf_node<int,_false> *)0x0) &&
             (uVar15 = (local_88.ptr)->_ref_count, (local_88.ptr)->_ref_count = uVar15 - 1,
             uVar15 == 1)) {
            free(local_88.ptr);
          }
LAB_001460ea:
          ref<immutable::rrb<int,_false,_6>_>::~ref(&local_80);
          return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
        }
        local_70 = (leaf_node<int,_false> *)malloc(0x118);
        plVar7 = local_70 + 1;
        local_70->child = (int *)plVar7;
        memset(plVar7,0,0x100);
        local_88.ptr = local_70;
        local_70->type = LEAF_NODE;
        local_70->len = 0x40;
        local_70->_ref_count = 1;
        local_70->guid = 0;
        if (uVar17 == 0) {
          uVar20 = 0x40;
LAB_00145f53:
          plVar9 = (prVar5->tail).ptr;
          if (plVar9 != (leaf_node<int,_false> *)0x0) {
            piVar16 = plVar9->child;
            uVar17 = 0;
            do {
              (&plVar7->type)[uVar2 + (int)uVar17] = piVar16[uVar17];
              uVar17 = uVar17 + 1;
            } while (uVar20 != uVar17);
            uVar15 = prVar5->tail_len;
            uVar17 = (ulong)(uVar15 - uVar20);
            local_78.ptr = (rrb<int,_false,_6> *)malloc(uVar17 * 4 + 0x18);
            __s = &(local_78.ptr)->root;
            uVar15 = uVar15 - uVar20;
            local_70 = (leaf_node<int,_false> *)CONCAT44(local_70._4_4_,uVar15);
            (local_78.ptr)->shift = uVar15;
            (local_78.ptr)->cnt = 0;
            ((local_78.ptr)->tail).ptr = (leaf_node<int,_false> *)__s;
            *(undefined4 *)&(local_78.ptr)->field_0xc = 0;
            if (uVar15 == 0) {
              (local_78.ptr)->tail_len = 1;
              uVar15 = 0;
            }
            else {
              memset(__s,0,uVar17 << 2);
              (local_78.ptr)->tail_len = 1;
              plVar7 = (prVar5->tail).ptr;
              if (plVar7 == (leaf_node<int,_false> *)0x0) goto LAB_00146125;
              piVar16 = plVar7->child;
              uVar17 = 0;
              do {
                *(int *)((long)&__s->ptr + uVar17 * 4) = piVar16[uVar20 + (int)uVar17];
                uVar17 = uVar17 + 1;
                uVar15 = (uint32_t)local_70;
              } while ((uint32_t)local_70 + ((uint32_t)local_70 == 0) != uVar17);
            }
            this = (immutable *)local_60;
            ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(local_48,&local_88);
            rVar14.ptr = local_80.ptr;
            if (local_80.ptr == (rrb<int,_false,_6> *)0x0) goto LAB_00146106;
            (local_80.ptr)->tail_len = uVar15;
            prVar4 = left->ptr;
            local_68.ptr = (rrb<int,_false,_6> *)malloc(0x28);
            uVar10 = prVar4->cnt;
            uVar11 = prVar4->shift;
            uVar13 = prVar4->tail_len;
            uVar12 = *(undefined4 *)&prVar4->field_0xc;
            ptVar6 = (prVar4->root).ptr;
            ((local_68.ptr)->tail).ptr = (prVar4->tail).ptr;
            ((local_68.ptr)->root).ptr = ptVar6;
            (local_68.ptr)->cnt = uVar10;
            (local_68.ptr)->shift = uVar11;
            (local_68.ptr)->tail_len = uVar13;
            *(undefined4 *)&(local_68.ptr)->field_0xc = uVar12;
            uVar12 = *(undefined4 *)&prVar4->field_0x24;
            (local_68.ptr)->_ref_count = prVar4->_ref_count;
            *(undefined4 *)&(local_68.ptr)->field_0x24 = uVar12;
            ptVar6 = ((local_68.ptr)->root).ptr;
            if (ptVar6 != (tree_node<int,_false> *)0x0) {
              puVar1 = &ptVar6->_ref_count;
              *puVar1 = *puVar1 + 1;
            }
            plVar7 = ((local_68.ptr)->tail).ptr;
            if (plVar7 != (leaf_node<int,_false> *)0x0) {
              puVar1 = &plVar7->_ref_count;
              *puVar1 = *puVar1 + 1;
            }
            (local_68.ptr)->_ref_count = 1;
            (local_68.ptr)->cnt = (rVar14.ptr)->cnt - uVar15;
            rrb_details::push_down_tail<int,false,6>
                      ((rrb_details *)this,&local_68,&local_80,
                       (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_78);
            ref<immutable::rrb<int,_false,_6>_>::~ref(&local_68);
            if ((local_78.ptr != (rrb<int,_false,_6> *)0x0) &&
               (uVar15 = (local_78.ptr)->tail_len, (local_78.ptr)->tail_len = uVar15 - 1,
               uVar15 == 1)) {
              free(local_78.ptr);
            }
            goto LAB_001460ce;
          }
        }
        else {
          plVar9 = (prVar4->tail).ptr;
          if (plVar9 != (leaf_node<int,_false> *)0x0) {
            piVar16 = plVar9->child;
            uVar18 = 0;
            do {
              (&plVar7->type)[uVar18] = piVar16[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar18 < uVar17);
            uVar20 = 0x40 - uVar2;
            goto LAB_00145f53;
          }
        }
LAB_00146125:
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
        ;
        goto LAB_0014611b;
      }
      local_88.ptr = (leaf_node<int,_false> *)0x0;
      local_78.ptr = (rrb<int,_false,_6> *)malloc(0x28);
      uVar15 = prVar4->cnt;
      uVar10 = prVar4->shift;
      uVar11 = prVar4->tail_len;
      uVar12 = *(undefined4 *)&prVar4->field_0xc;
      ptVar6 = (prVar4->root).ptr;
      ((local_78.ptr)->tail).ptr = (prVar4->tail).ptr;
      ((local_78.ptr)->root).ptr = ptVar6;
      (local_78.ptr)->cnt = uVar15;
      (local_78.ptr)->shift = uVar10;
      (local_78.ptr)->tail_len = uVar11;
      *(undefined4 *)&(local_78.ptr)->field_0xc = uVar12;
      uVar12 = *(undefined4 *)&prVar4->field_0x24;
      (local_78.ptr)->_ref_count = prVar4->_ref_count;
      *(undefined4 *)&(local_78.ptr)->field_0x24 = uVar12;
      ptVar6 = ((local_78.ptr)->root).ptr;
      if (ptVar6 != (tree_node<int,_false> *)0x0) {
        puVar1 = &ptVar6->_ref_count;
        *puVar1 = *puVar1 + 1;
      }
      plVar7 = ((local_78.ptr)->tail).ptr;
      if (plVar7 != (leaf_node<int,_false> *)0x0) {
        puVar1 = &plVar7->_ref_count;
        *puVar1 = *puVar1 + 1;
      }
      (local_78.ptr)->_ref_count = 1;
      rrb_details::push_down_tail<int,false,6>((rrb_details *)&local_68,left,&local_78,&local_88);
      piVar16 = (int *)malloc(0x28);
      piVar16[0] = 0;
      piVar16[1] = 0;
      piVar16[2] = 0;
      piVar16[4] = 0;
      piVar16[5] = 0;
      piVar16[6] = 0;
      piVar16[7] = 0;
      local_80.ptr = (rrb<int,_false,_6> *)malloc(0x18);
      ((local_80.ptr)->tail).ptr = (leaf_node<int,_false> *)0x0;
      (local_80.ptr)->cnt = 0;
      (local_80.ptr)->shift = 0;
      *(undefined8 *)&(local_80.ptr)->tail_len = 1;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(piVar16 + 4),
                 (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_80);
      if ((local_80.ptr != (rrb<int,_false,_6> *)0x0) &&
         (uVar15 = (local_80.ptr)->tail_len, (local_80.ptr)->tail_len = uVar15 - 1, uVar15 == 1)) {
        free(local_80.ptr);
      }
      *(int **)this = piVar16;
      piVar16[8] = 1;
      if ((local_68.ptr != (rrb<int,_false,_6> *)0x0) &&
         (prVar4 = right->ptr, prVar4 != (rrb<int,_false,_6> *)0x0)) {
        *piVar16 = prVar4->cnt + (local_68.ptr)->cnt;
        rrb_details::concat_sub_tree<int,false,6>
                  ((rrb_details *)&local_58,&(local_68.ptr)->root,(local_68.ptr)->shift,
                   &prVar4->root,prVar4->shift,true);
        local_50.ptr = (tree_node<int,_false> *)local_58.ptr;
        if (local_58.ptr != (internal_node<int,_false> *)0x0) {
          (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
        }
        uVar15 = rrb_details::find_shift<int,false,6>(&local_50);
        if (*(long *)this != 0) {
          *(uint32_t *)(*(long *)this + 4) = uVar15;
          rrb_details::set_sizes<int,false,6>((rrb_details *)&local_40,&local_58,uVar15);
          lVar8 = *(long *)this;
          if (lVar8 != 0) {
            if (local_40 != (internal_node<int,_false> *)0x0) {
              local_40->_ref_count = local_40->_ref_count + 1;
            }
            local_80.ptr = *(rrb<int,_false,_6> **)(lVar8 + 0x18);
            *(internal_node<int,_false> **)(lVar8 + 0x18) = local_40;
            ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                      ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_80);
            rrb_details::release<int>(local_40);
            if ((right->ptr != (rrb<int,_false,_6> *)0x0) && (*(long *)this != 0)) {
              ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                        ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)
                         (*(long *)this + 0x10),&right->ptr->tail);
              if ((right->ptr != (rrb<int,_false,_6> *)0x0) && (*(long *)this != 0)) {
                *(uint32_t *)(*(long *)this + 8) = right->ptr->tail_len;
                ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_50);
                rrb_details::release<int>(local_58.ptr);
                ref<immutable::rrb<int,_false,_6>_>::~ref(&local_68);
                ref<immutable::rrb<int,_false,_6>_>::~ref(&local_78);
                if (local_88.ptr == (leaf_node<int,_false> *)0x0) {
                  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
                }
                uVar15 = (local_88.ptr)->_ref_count;
                (local_88.ptr)->_ref_count = uVar15 - 1;
                if (uVar15 != 1) {
                  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
                }
                free(local_88.ptr);
                return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
              }
            }
          }
        }
      }
    }
  }
LAB_00146106:
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_0014611b:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }